

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::f_rot(Forth *this)

{
  ForthStack<double> *this_00;
  double Value;
  
  requireFStackDepth(this,3,"FROT");
  this_00 = &this->fStack;
  Value = ForthStack<double>::getTop(this_00,2);
  ForthStack<double>::moveStack(this_00,2,1,2);
  ForthStack<double>::setTop(this_00,Value);
  return;
}

Assistant:

void f_rot() {
			REQUIRE_FSTACK_DEPTH(3, "FROT");
			auto n = 2;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}